

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeUnidirectionalLSTMLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  UniDirectionalLSTMLayerParams *this_00;
  uint64_t val;
  uint64_t val_00;
  LSTMParams *this_01;
  ShapeRange *other;
  mapped_type *this_02;
  mapped_type *this_03;
  ShapeConstraint *hiddenOutShape;
  ShapeConstraint *hiddenInShape;
  ShapeConstraint *stateOutShape;
  ShapeConstraint *stateInShape;
  size_t outSize;
  size_t inSize;
  UniDirectionalLSTMLayerParams *recurrent;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,psVar3);
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,psVar3);
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  ShapeConstraint::setName(pmVar5,psVar3);
  this_00 = Specification::NeuralNetworkLayer::unidirectionallstm(specLayer);
  val = Specification::UniDirectionalLSTMLayerParams::inputvectorsize(this_00);
  val_00 = Specification::UniDirectionalLSTMLayerParams::outputvectorsize(this_00);
  ShapeConstraint::setChannel(pmVar4,val);
  ShapeConstraint::setHeight(pmVar4,1);
  ShapeConstraint::setWidth(pmVar4,1);
  ShapeConstraint::setChannel(pmVar5,val_00);
  ShapeConstraint::setHeight(pmVar5,1);
  ShapeConstraint::setWidth(pmVar5,1);
  this_01 = Specification::UniDirectionalLSTMLayerParams::params(this_00);
  bVar1 = Specification::LSTMParams::sequenceoutput(this_01);
  if (bVar1) {
    other = ShapeConstraint::sequenceRange(pmVar4);
    ShapeConstraint::updateSequenceRange(pmVar5,other);
  }
  else {
    ShapeConstraint::setSequence(pmVar5,1);
  }
  iVar2 = Specification::NeuralNetworkLayer::input_size(specLayer);
  if (2 < iVar2) {
    psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,1);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](&this->blobShapes,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
             ::operator[](&this->blobShapes,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,1);
    ShapeConstraint::setName(pmVar5,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,2);
    this_02 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](&this->blobShapes,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,2);
    this_03 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](&this->blobShapes,psVar3);
    psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,2);
    ShapeConstraint::setName(this_03,psVar3);
    ShapeConstraint::setSequence(pmVar4,1);
    ShapeConstraint::setChannel(pmVar4,val_00);
    ShapeConstraint::setHeight(pmVar4,1);
    ShapeConstraint::setWidth(pmVar4,1);
    ShapeConstraint::setSequence(this_02,1);
    ShapeConstraint::setChannel(this_02,val_00);
    ShapeConstraint::setHeight(this_02,1);
    ShapeConstraint::setWidth(this_02,1);
    ShapeConstraint::setSequence(pmVar5,1);
    ShapeConstraint::setChannel(pmVar5,val_00);
    ShapeConstraint::setHeight(pmVar5,1);
    ShapeConstraint::setWidth(pmVar5,1);
    ShapeConstraint::setSequence(this_03,1);
    ShapeConstraint::setChannel(this_03,val_00);
    ShapeConstraint::setHeight(this_03,1);
    ShapeConstraint::setWidth(this_03,1);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeUnidirectionalLSTMLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Unidirectional LSTM layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Unidirectional LSTM layer " << specLayer.name() << " output shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

    const Specification::UniDirectionalLSTMLayerParams& recurrent = specLayer.unidirectionallstm();

    size_t inSize = (size_t)recurrent.inputvectorsize();
    size_t outSize = (size_t)recurrent.outputvectorsize();

    inputShape.setChannel(inSize);
    inputShape.setHeight(1);
    inputShape.setWidth(1);

    outputShape.setChannel(outSize);
    outputShape.setHeight(1);
    outputShape.setWidth(1);
    if (recurrent.params().sequenceoutput()) {
        outputShape.updateSequenceRange(inputShape.sequenceRange());
    }
    else {
        outputShape.setSequence(1);
    }

    if (specLayer.input_size() < 3) {
        return;
    }

    ShapeConstraint& stateInShape = blobShapes[specLayer.input(1)];
    ShapeConstraint& stateOutShape = blobShapes[specLayer.output(1)];
    stateOutShape.setName(specLayer.output(1));

    ShapeConstraint& hiddenInShape = blobShapes[specLayer.input(2)];
    ShapeConstraint& hiddenOutShape = blobShapes[specLayer.output(2)];
    hiddenOutShape.setName(specLayer.output(2));

    stateInShape.setSequence(1);
    stateInShape.setChannel(outSize);
    stateInShape.setHeight(1);
    stateInShape.setWidth(1);

    hiddenInShape.setSequence(1);
    hiddenInShape.setChannel(outSize);
    hiddenInShape.setHeight(1);
    hiddenInShape.setWidth(1);

    stateOutShape.setSequence(1);
    stateOutShape.setChannel(outSize);
    stateOutShape.setHeight(1);
    stateOutShape.setWidth(1);

    hiddenOutShape.setSequence(1);
    hiddenOutShape.setChannel(outSize);
    hiddenOutShape.setHeight(1);
    hiddenOutShape.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Unidirectional LSTM layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Unidirectional LSTM layer " << specLayer.name() << " output shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.output_size(); i++) {
        std::cout << blobShapes[specLayer.output(i)];
    }
#endif

}